

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_describe_drds_instances.cc
# Opt level: O0

void anon_unknown.dwarf_519a2::Json2Type(Value *value,DrdsDescribeDrdsInstancesVipType *item)

{
  bool bVar1;
  Value *pVVar2;
  string local_78;
  string local_58;
  string local_38;
  DrdsDescribeDrdsInstancesVipType *local_18;
  DrdsDescribeDrdsInstancesVipType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (DrdsDescribeDrdsInstancesVipType *)value;
  bVar1 = Json::Value::isMember(value,"IP");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"IP");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Port");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Port");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->port,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Type");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Type");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->type,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, DrdsDescribeDrdsInstancesVipType* item) {
  if(value.isMember("IP")) {
    item->ip = value["IP"].asString();
  }
  if(value.isMember("Port")) {
    item->port = value["Port"].asString();
  }
  if(value.isMember("Type")) {
    item->type = value["Type"].asString();
  }
}